

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::removeItem(QGraphicsScene *this,QGraphicsItem *item)

{
  QGraphicsScenePrivate *this_00;
  long lVar1;
  QGraphicsView **ppQVar2;
  bool bVar3;
  QGraphicsScene *pQVar4;
  QMetaType QVar5;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  QGraphicsScene *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  QGraphicsScene *t;
  QMetaType local_a0;
  QVariant local_98;
  QMetaType local_78 [4];
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    removeItem();
  }
  else {
    this_00 = *(QGraphicsScenePrivate **)(this + 8);
    pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(item);
    if (pQVar4 == this) {
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      pcStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      local_a0.d_ptr = (QMetaTypeInterface *)0x0;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType)
        ;
      }
      ::QVariant::moveConstruct
                ((QMetaTypeInterface *)local_78,
                 &QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType);
      paVar6 = &local_58;
      (*item->_vptr_QGraphicsItem[0x21])(paVar6,item,0xb,(QMetaTypeInterface *)local_78);
      ::QVariant::~QVariant((QVariant *)local_78);
      local_78[0].d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType;
      local_a0.d_ptr = (QMetaTypeInterface *)((ulong)pcStack_40 & 0xfffffffffffffffc);
      bVar3 = comparesEqual(&local_a0,local_78);
      if (bVar3) {
        if (((ulong)pcStack_40 & 1) == 0) {
          paVar6 = &local_58;
        }
        else {
          paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                   CONCAT44(local_58._4_4_,local_58._0_4_));
        }
        QVar5.d_ptr = (QMetaTypeInterface *)paVar6->shared;
      }
      else {
        local_a0.d_ptr = (QMetaTypeInterface *)0x0;
        QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)pcStack_40 & 1) != 0) {
          paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                   CONCAT44(local_58._4_4_,local_58._0_4_));
        }
        QMetaType::convert(QVar5,paVar6,local_78[0],&local_a0);
        QVar5.d_ptr = local_a0.d_ptr;
      }
      if (QVar5.d_ptr == (QMetaTypeInterface *)this || QVar5.d_ptr == (QMetaTypeInterface *)0x0) {
        QGraphicsScenePrivate::removeItemHelper(this_00,item);
        (*item->_vptr_QGraphicsItem[0x21])(&local_98,item,0x10,&local_58);
        ::QVariant::~QVariant(&local_98);
        lVar1 = (this_00->views).d.size;
        if (lVar1 != 0) {
          ppQVar2 = (this_00->views).d.ptr;
          lVar8 = 0;
          do {
            QGraphicsViewPrivate::updateInputMethodSensitivity
                      (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar2 + lVar8) + 8));
            lVar8 = lVar8 + 8;
          } while (lVar1 << 3 != lVar8);
        }
      }
      else {
        addItem((QGraphicsScene *)QVar5.d_ptr,item);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      local_58._20_4_ = 0;
      pcStack_40 = "default";
      pQVar7 = QGraphicsItem::scene(item);
      QMessageLogger::warning
                ((char *)local_58.data,
                 "QGraphicsScene::removeItem: item %p\'s scene (%p) is different from this scene (%p)"
                 ,item,pQVar7,this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::removeItem(QGraphicsItem *item)
{
    // ### Refactoring: This function shares much functionality with _q_removeItemLater()
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::removeItem: cannot remove 0-item");
        return;
    }
    if (item->scene() != this) {
        qWarning("QGraphicsScene::removeItem: item %p's scene (%p)"
                 " is different from this scene (%p)",
                 item, item->scene(), this);
        return;
    }

    // Notify the item that it's scene is changing to 0, allowing the item to
    // react.
    const QVariant newSceneVariant(item->itemChange(QGraphicsItem::ItemSceneChange,
                                                    QVariant::fromValue<QGraphicsScene *>(0)));
    QGraphicsScene *targetScene = qvariant_cast<QGraphicsScene *>(newSceneVariant);
    if (targetScene != nullptr && targetScene != this) {
        targetScene->addItem(item);
        return;
    }

    d->removeItemHelper(item);

    // Deliver post-change notification
    item->itemChange(QGraphicsItem::ItemSceneHasChanged, newSceneVariant);

    d->updateInputMethodSensitivityInViews();
}